

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

presentation_type fmt::v10::detail::parse_printf_presentation_type(char c,type t)

{
  presentation_type pVar1;
  undefined3 in_register_00000039;
  int iVar2;
  bool bVar3;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  pVar1 = none;
  switch(iVar2) {
  case 0x61:
    bVar3 = (0xe00U >> (t & 0x1f) & 1) != 0;
    pVar1 = hexfloat_lower;
    break;
  case 0x62:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_0016f3e1_caseD_62;
  case 99:
    bVar3 = (0x1feU >> (t & 0x1f) & 1) != 0;
    pVar1 = chr;
    break;
  case 100:
    return (0x1feU >> (t & 0x1f) & 1) != 0;
  case 0x65:
    return ((0xe00U >> (t & 0x1f) & 1) != 0) * '\t';
  case 0x66:
    bVar3 = (0xe00U >> (t & 0x1f) & 1) != 0;
    pVar1 = fixed_lower;
    break;
  case 0x67:
    bVar3 = (0xe00U >> (t & 0x1f) & 1) != 0;
    pVar1 = general_lower;
    break;
  case 0x6f:
    return ((0x1feU >> (t & 0x1f) & 1) != 0) * '\x02';
  case 0x70:
    bVar3 = (0x5000U >> (t & 0x1f) & 1) != 0;
    pVar1 = pointer;
    break;
  case 0x73:
    return ((0x3000U >> (t & 0x1f) & 1) != 0) << 4;
  case 0x78:
    return ((0x1feU >> (t & 0x1f) & 1) != 0) * '\x03';
  default:
    pVar1 = none;
    switch(iVar2) {
    case 0x41:
      pVar1 = ((0xe00U >> (t & 0x1f) & 1) != 0) << 3;
    case 0x42:
    case 0x43:
    case 0x44:
switchD_0016f3e1_caseD_62:
      return pVar1;
    case 0x45:
      bVar3 = (0xe00U >> (t & 0x1f) & 1) != 0;
      pVar1 = exp_upper;
      break;
    case 0x46:
      bVar3 = (0xe00U >> (t & 0x1f) & 1) != 0;
      pVar1 = fixed_upper;
      break;
    case 0x47:
      bVar3 = (0xe00U >> (t & 0x1f) & 1) != 0;
      pVar1 = general_upper;
      break;
    default:
      if (iVar2 != 0x58) {
        return none;
      }
      return ((0x1feU >> (t & 0x1f) & 1) != 0) << 2;
    }
  }
  if (!bVar3) {
    pVar1 = none;
  }
  return pVar1;
}

Assistant:

inline auto parse_printf_presentation_type(char c, type t)
    -> presentation_type {
  using pt = presentation_type;
  constexpr auto integral_set = sint_set | uint_set | bool_set | char_set;
  switch (c) {
  case 'd':
    return in(t, integral_set) ? pt::dec : pt::none;
  case 'o':
    return in(t, integral_set) ? pt::oct : pt::none;
  case 'x':
    return in(t, integral_set) ? pt::hex_lower : pt::none;
  case 'X':
    return in(t, integral_set) ? pt::hex_upper : pt::none;
  case 'a':
    return in(t, float_set) ? pt::hexfloat_lower : pt::none;
  case 'A':
    return in(t, float_set) ? pt::hexfloat_upper : pt::none;
  case 'e':
    return in(t, float_set) ? pt::exp_lower : pt::none;
  case 'E':
    return in(t, float_set) ? pt::exp_upper : pt::none;
  case 'f':
    return in(t, float_set) ? pt::fixed_lower : pt::none;
  case 'F':
    return in(t, float_set) ? pt::fixed_upper : pt::none;
  case 'g':
    return in(t, float_set) ? pt::general_lower : pt::none;
  case 'G':
    return in(t, float_set) ? pt::general_upper : pt::none;
  case 'c':
    return in(t, integral_set) ? pt::chr : pt::none;
  case 's':
    return in(t, string_set | cstring_set) ? pt::string : pt::none;
  case 'p':
    return in(t, pointer_set | cstring_set) ? pt::pointer : pt::none;
  default:
    return pt::none;
  }
}